

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

hs_database_t * ZiLoadDatabase(char *dbfile,bool has_header,ZiEncryptHdr *header_recver)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  void *this;
  undefined1 auVar4 [16];
  char *pcStack_280;
  hs_error_t err;
  hs_database_t *db;
  char *bytes;
  size_t db_size;
  char *hdr_buffer;
  size_t hdr_len;
  undefined8 local_250;
  streamoff local_248;
  size_t total_len;
  char local_230 [8];
  ifstream is;
  ZiEncryptHdr *header_recver_local;
  bool has_header_local;
  char *dbfile_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Loading database from file: ");
  poVar3 = std::operator<<(poVar3,dbfile);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_230);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_230,(_Ios_Openmode)dbfile);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ ERROR ]Open ");
    poVar3 = std::operator<<(poVar3,dbfile);
    poVar3 = std::operator<<(poVar3," Failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    dbfile_local = (char *)0x0;
  }
  else {
    std::istream::seekg((long)local_230,_S_beg);
    auVar4 = std::istream::tellg();
    local_250 = auVar4._8_8_;
    hdr_len = auVar4._0_8_;
    local_248 = std::fpos::operator_cast_to_long((fpos *)&hdr_len);
    std::istream::seekg((long)local_230,_S_beg);
    hdr_buffer = (char *)0x0;
    if (has_header) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Deserialize: Extracting header...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      hdr_buffer = (char *)0xc;
      db_size = (size_t)operator_new__(0xc);
      std::istream::read(local_230,db_size);
      if (header_recver != (ZiEncryptHdr *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Deserialize: Writing Header...");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        *(undefined8 *)header_recver = *(undefined8 *)db_size;
        *(undefined2 *)(header_recver + 8) = *(undefined2 *)(db_size + 8);
        header_recver[10] = *(ZiEncryptHdr *)(db_size + 10);
      }
      if (db_size != 0) {
        operator_delete__((void *)db_size);
      }
    }
    bytes = (char *)(local_248 - (long)hdr_buffer);
    db = (hs_database_t *)0x0;
    db = (hs_database_t *)operator_new__((ulong)bytes);
    std::istream::read(local_230,(long)db);
    std::ifstream::close();
    pcStack_280 = (char *)0x0;
    iVar2 = hs_deserialize_database(db,bytes,&stack0xfffffffffffffd80);
    if (db != (hs_database_t *)0x0) {
      operator_delete__(db);
    }
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] Deserialize Failed with: ");
      this = (void *)std::ostream::operator<<(poVar3,iVar2);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[ Info ] Deserialize database successfully");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    dbfile_local = pcStack_280;
  }
  total_len._0_4_ = 1;
  std::ifstream::~ifstream(local_230);
  return (hs_database_t *)dbfile_local;
}

Assistant:

hs_database_t* ZiLoadDatabase(const char* dbfile, bool has_header,
    struct ZiEncryptHdr* header_recver)
{
    cout << "[ Info ] Loading database from file: " << dbfile << endl;

    std::ifstream is;
    is.open(dbfile, ios::in | ios::binary);
    if (!is.is_open())
    {
        cerr << "[ ERROR ]Open " << dbfile << " Failed" << endl;
        return nullptr;
    }
    // Get the file's size
    is.seekg(0, ios::end);
    size_t total_len = is.tellg();
    // back to beginning and ready to read.
    is.seekg(0, ios::beg);
    // if header exists, extrace it first if @p header_recver is not nullptr
    size_t hdr_len = 0;
    if (has_header)
    {
        cout << "[ Info ] Deserialize: Extracting header..." << endl;

        hdr_len = sizeof(struct ZiEncryptHdr); // TODO assign a magic number
        char* hdr_buffer = new char[hdr_len];
        is.read(hdr_buffer, hdr_len);
        if (header_recver) // maybe assert is better
        {
            cout << "[ Info ] Deserialize: Writing Header..." << endl;
            *header_recver = *(struct ZiEncryptHdr*) hdr_buffer;
        }
        delete[] hdr_buffer;
    }
    // now read the real db data.
    size_t db_size = total_len - hdr_len;
    char* bytes = nullptr;
    bytes = new char[db_size];
    is.read(bytes, db_size);
    is.close();

    hs_database_t* db = nullptr;
    hs_error_t err = hs_deserialize_database(bytes, db_size, &db);

    delete[] bytes;

    if (err != HS_SUCCESS)
    {
        cerr << "[ ERROR ] Deserialize Failed with: " << err << endl;
        exit(-1);
    }
    cout << "[ Info ] Deserialize database successfully" << endl;

    return db;
}